

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

Element * __thiscall
wasm::analysis::Vector<wasm::RandomFullLattice>::getBottom
          (Element *__return_storage_ptr__,Vector<wasm::RandomFullLattice> *this)

{
  size_type __n;
  RandomFullLattice local_38;
  allocator_type local_21;
  
  __n = this->size;
  RandomFullLattice::getBottom(&local_38);
  std::
  vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
  ::vector(__return_storage_ptr__,__n,(value_type *)&local_38,&local_21);
  std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<void,_void_(*)(void_*)> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

Element getBottom() const noexcept {
    return Element(size, lattice.getBottom());
  }